

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O0

void __thiscall
Am_Enum_Support::Am_Enum_Support(Am_Enum_Support *this,char *string,Am_Value_Type in_type)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  char *__dest;
  char **ppcVar4;
  ulong uVar5;
  int local_44;
  int j;
  char **array;
  int i;
  char *hold;
  int len;
  Am_Value_Type in_type_local;
  char *string_local;
  Am_Enum_Support *this_local;
  
  Am_Type_Support::Am_Type_Support(&this->super_Am_Type_Support);
  (this->super_Am_Type_Support)._vptr_Am_Type_Support = (_func_int **)&PTR_Print_00410d30;
  this->type = in_type;
  sVar3 = strlen(string);
  iVar2 = (int)sVar3;
  uVar5 = (ulong)(iVar2 + 1);
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __dest = (char *)operator_new__(uVar5);
  strcpy(__dest,string);
  this->number = 1;
  for (array._0_4_ = 0; (int)array < iVar2; array._0_4_ = (int)array + 1) {
    if (string[(int)array] == ' ') {
      this->number = this->number + 1;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->number;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppcVar4 = (char **)operator_new__(uVar5);
  *ppcVar4 = __dest;
  local_44 = 1;
  for (array._0_4_ = 0; (int)array < iVar2; array._0_4_ = (int)array + 1) {
    if (__dest[(int)array] == ' ') {
      __dest[(int)array] = '\0';
      ppcVar4[local_44] = __dest + ((int)array + 1);
      local_44 = local_44 + 1;
    }
  }
  this->value_string = __dest;
  this->item = ppcVar4;
  Am_Register_Support(this->type,&this->super_Am_Type_Support);
  return;
}

Assistant:

Am_Enum_Support::Am_Enum_Support(const char *string, Am_Value_Type in_type)
{
  type = in_type;
  int len = strlen(string);
  char *hold = new char[len + 1];
  strcpy(hold, string);
  int i;
  number = 1;
  for (i = 0; i < len; ++i) {
    if (string[i] == ' ')
      ++number;
  }
  char **array = new char *[number];
  array[0] = hold;
  int j = 1;
  for (i = 0; i < len; ++i) {
    if (hold[i] == ' ') {
      hold[i] = '\0';
      array[j] = &hold[i + 1];
      ++j;
    }
  }
  value_string = hold;
  item = array;
  Am_Register_Support(type, this);
}